

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

uint __thiscall ON_SubDMeshFragmentGrid::GridId(ON_SubDMeshFragmentGrid *this)

{
  ushort uVar1;
  int iVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar5 = 0;
  if (this->m_F == (uint *)0x0) {
    uVar1 = this->m_F_level_of_detail;
    do {
      bVar7 = false;
      uVar6 = 0;
      if (this->m_F_count != 1) {
        uVar4 = 0;
        do {
          bVar7 = 0xe < uVar4;
          if (bVar7) goto LAB_00614ad2;
          bVar3 = (byte)uVar4;
          uVar4 = uVar4 + 2;
          uVar6 = (ulong)uVar4;
        } while (4 << (bVar3 & 0x1f) != (uint)this->m_F_count);
      }
      iVar2 = (uint)uVar1 + (uint)uVar1;
      if ((uint)(uVar6 >> 1) < (uint)uVar1) {
        iVar2 = (int)uVar6;
      }
      uVar5 = (int)uVar6 * 0x10 + iVar2;
LAB_00614ad2:
    } while (bVar7);
  }
  return uVar5;
}

Assistant:

unsigned int ON_SubDMeshFragmentGrid::GridId() const
{
  for (;;)
  {
    if (nullptr != m_F)
      break;

    // m_F_count = 2^(2n)
    for (unsigned int id = 0; id <= 16; id += 2)
    {
      if ((1U << id) == m_F_count)
      {
        id /= 2; // id = "n"
        unsigned int lod = (m_F_level_of_detail > id) ? id : (unsigned int)m_F_level_of_detail;
        id = 32*id + 2*lod;
        return id;
      }
    }
  }

  return 0;
}